

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
Generator_isolatedFirstOrderModel_Test::TestBody(Generator_isolatedFirstOrderModel_Test *this)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  char *pcVar5;
  unsigned_long *in_R9;
  ValidatorPtr validator;
  allocator<char> local_1e1;
  unsigned_long local_1e0;
  AnalyserPtr analyser;
  unsigned_long local_1b8;
  AssertionResult gtest_ar_1;
  ComponentPtr component;
  ModelPtr model;
  UnitsPtr mS_per_cm2;
  UnitsPtr microA_per_cm2;
  UnitsPtr per_ms;
  UnitsPtr mV;
  VariablePtr gamma;
  VariablePtr g_y;
  VariablePtr E_y;
  VariablePtr y;
  VariablePtr beta_y;
  VariablePtr alpha_y;
  VariablePtr V;
  string mathHeader;
  UnitsPtr ms;
  VariablePtr i_y;
  VariablePtr t;
  string equation1;
  string mathFooter;
  string equation2;
  
  libcellml::Model::create();
  peVar2 = model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mathHeader,"Tutorial4_FirstOrderModel",(allocator<char> *)&equation1);
  libcellml::NamedEntity::setName((string *)peVar2);
  std::__cxx11::string::~string((string *)&mathHeader);
  libcellml::Component::create();
  peVar1 = component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mathHeader,"IonChannel",(allocator<char> *)&equation1);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&mathHeader);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mathHeader,
             "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">"
             ,(allocator<char> *)&equation1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation1,
             "<apply>\n  <eq/>\n  <apply>\n    <diff/>\n    <bvar>\n      <ci>t</ci>\n    </bvar>\n    <ci>y</ci>\n  </apply>\n  <apply>\n    <minus/>\n    <apply>\n      <times/>\n      <ci>alpha_y</ci>\n      <apply>\n        <minus/>\n        <cn cellml:units=\"dimensionless\">1</cn>\n        <ci>y</ci>\n      </apply>\n    </apply>\n    <apply>\n      <times/>\n      <ci>beta_y</ci>\n      <ci>y</ci>\n    </apply>\n  </apply>\n</apply>\n"
             ,(allocator<char> *)&equation2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&equation2,
             "<apply>\n  <eq/>\n  <ci>i_y</ci>\n  <apply>\n    <times/>\n    <ci>g_y</ci>\n    <apply>\n      <minus/>\n      <ci>V</ci>\n      <ci>E_y</ci>\n    </apply>\n    <apply>\n      <power/>\n      <ci>y</ci>\n      <ci>gamma</ci>\n    </apply>\n  </apply>\n</apply>"
             ,(allocator<char> *)&mathFooter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&mathFooter,"</math>",(allocator<char> *)&validator);
  libcellml::Component::setMath
            ((string *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::appendMath
            ((string *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::appendMath
            ((string *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::appendMath
            ((string *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::create();
  peVar4 = t.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"t",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millisecond",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)t.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::create();
  peVar4 = V.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"V",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millivolt",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)V.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(0.0);
  libcellml::Variable::create();
  peVar4 = alpha_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"alpha_y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"per_millisecond",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             alpha_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  peVar4 = beta_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"beta_y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"per_millisecond",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             beta_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(2.0);
  libcellml::Variable::create();
  peVar4 = y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"dimensionless",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(1.0);
  libcellml::Variable::create();
  peVar4 = E_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"E_y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millivolt",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             E_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(-85.0);
  libcellml::Variable::create();
  peVar4 = i_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"i_y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"microA_per_cm2",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             i_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::create();
  peVar4 = g_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"g_y",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"milliS_per_cm2",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             g_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(36.0);
  libcellml::Variable::create();
  peVar4 = gamma.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"gamma",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar4);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"dimensionless",(allocator<char> *)&analyser);
  libcellml::Variable::setUnits
            ((string *)
             gamma.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Variable::setInitialValue(4.0);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Component::addVariable
            ((shared_ptr *)
             component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Units::create();
  peVar3 = ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millisecond",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"second",(allocator<char> *)&mV);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"milli",(allocator<char> *)&per_ms);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_1,"",(allocator<char> *)&microA_per_cm2);
  libcellml::Units::addUnit
            ((string *)ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&validator,1.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Units::create();
  peVar3 = mV.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millivolt",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"volt",(allocator<char> *)&per_ms);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"milli",(allocator<char> *)&microA_per_cm2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_1,"",(allocator<char> *)&mS_per_cm2);
  libcellml::Units::addUnit
            ((string *)mV.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&validator,1.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Units::create();
  peVar3 = per_ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"per_millisecond",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"millisecond",(allocator<char> *)&gtest_ar_1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"",(allocator<char> *)&microA_per_cm2);
  libcellml::Units::addUnit
            ((string *)
             per_ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,-1.0,
             (string *)&validator);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Units::create();
  peVar3 = microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"microA_per_cm2",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&validator);
  peVar3 = microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"ampere",(allocator<char> *)&mS_per_cm2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"micro",(allocator<char> *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_1,"",(allocator<char> *)&local_1b8);
  libcellml::Units::addUnit((string *)peVar3,(string *)&validator,1.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"metre",(allocator<char> *)&mS_per_cm2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"centi",(allocator<char> *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar_1,"",(allocator<char> *)&local_1b8);
  libcellml::Units::addUnit
            ((string *)
             microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&validator,-2.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Units::create();
  peVar3 = mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"milliS_per_cm2",(allocator<char> *)&analyser);
  libcellml::NamedEntity::setName((string *)peVar3);
  std::__cxx11::string::~string((string *)&validator);
  peVar3 = mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"siemens",(allocator<char> *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"milli",(allocator<char> *)&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_1,"",&local_1e1);
  libcellml::Units::addUnit((string *)peVar3,(string *)&validator,1.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&validator,"metre",(allocator<char> *)&local_1e0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&analyser,"centi",(allocator<char> *)&local_1b8);
  pcVar5 = "";
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_1,"",&local_1e1);
  libcellml::Units::addUnit
            ((string *)
             mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&validator,-2.0,1.0,(string *)&analyser);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&analyser);
  std::__cxx11::string::~string((string *)&validator);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Model::linkUnits();
  libcellml::Validator::create();
  libcellml::Validator::validateModel
            ((shared_ptr *)
             validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_1.success_ = false;
  gtest_ar_1._1_7_ = 0;
  local_1e0 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((AssertionResult *)&analyser,(internal *)"size_t(0)","validator->issueCount()",
             &gtest_ar_1.success_,&local_1e0,in_R9);
  if ((char)analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      '\0') {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar5 = *(char **)analyser.
                         super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xc9,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1e0,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1e0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel
            ((shared_ptr *)
             CONCAT71(analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr._1_7_,
                      (char)analyser.
                            super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr));
  local_1e0 = 0;
  local_1b8 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (&gtest_ar_1,(internal *)"size_t(0)","analyser->issueCount()",(char *)&local_1e0,
             &local_1b8,in_R9);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_1e0);
    if (gtest_ar_1._8_8_ == 0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)gtest_ar_1._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/isolated/generator.cpp"
               ,0xd1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b8,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1e0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&analyser.super___shared_ptr<libcellml::Analyser,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&validator.super___shared_ptr<libcellml::Validator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mS_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&microA_per_cm2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&per_ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mV.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ms.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&gamma.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&g_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&i_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&E_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&beta_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&alpha_y.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&V.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&t.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&mathFooter);
  std::__cxx11::string::~string((string *)&equation2);
  std::__cxx11::string::~string((string *)&equation1);
  std::__cxx11::string::~string((string *)&mathHeader);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&component.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Generator, isolatedFirstOrderModel)
{
    // This test resulted from https://github.com/cellml/libcellml/issues/432

    //  1.a   Create the model instance.
    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("Tutorial4_FirstOrderModel");

    //  1.b   Create a component and add it into the model.
    libcellml::ComponentPtr component = libcellml::Component::create();
    component->setName("IonChannel");
    model->addComponent(component);

    //  2.a   Define the mathematics.
    const std::string mathHeader = "<math xmlns=\"http://www.w3.org/1998/Math/MathML\" xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\">";

    // dy/dt = alpha_y*(1-y) - beta_y*y
    const std::string equation1 =
        "<apply>\n"
        "  <eq/>\n"
        "  <apply>\n"
        "    <diff/>\n"
        "    <bvar>\n"
        "      <ci>t</ci>\n"
        "    </bvar>\n"
        "    <ci>y</ci>\n"
        "  </apply>\n"
        "  <apply>\n"
        "    <minus/>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>alpha_y</ci>\n"
        "      <apply>\n"
        "        <minus/>\n"
        "        <cn cellml:units=\"dimensionless\">1</cn>\n"
        "        <ci>y</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <times/>\n"
        "      <ci>beta_y</ci>\n"
        "      <ci>y</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>\n";
    // i_y = g_y*power(y,gamma)*(V-E_y)
    const std::string equation2 =
        "<apply>\n"
        "  <eq/>\n"
        "  <ci>i_y</ci>\n"
        "  <apply>\n"
        "    <times/>\n"
        "    <ci>g_y</ci>\n"
        "    <apply>\n"
        "      <minus/>\n"
        "      <ci>V</ci>\n"
        "      <ci>E_y</ci>\n"
        "    </apply>\n"
        "    <apply>\n"
        "      <power/>\n"
        "      <ci>y</ci>\n"
        "      <ci>gamma</ci>\n"
        "    </apply>\n"
        "  </apply>\n"
        "</apply>";
    const std::string mathFooter = "</math>";

    //  2.b   Add the maths to the component. Note that there is only one maths
    //        string stored, so parts which are appended must create a viable
    //        MathML string when concatenated. To clear any string, which is
    //        already stored, simply call setMath("") with an empty string.
    component->setMath(mathHeader);
    component->appendMath(equation1);
    component->appendMath(equation2);
    component->appendMath(mathFooter);

    //  3.a,b Declaring the variables, their names, units, and initial conditions
    //        Note that the names given to variables must be the same as that used
    //        within the <ci> blocks in the MathML string we created in step 2.a.

    libcellml::VariablePtr t = libcellml::Variable::create();
    t->setName("t");
    t->setUnits("millisecond");
    // Note: time is our integration base variable so it is not initialised.

    libcellml::VariablePtr V = libcellml::Variable::create();
    V->setName("V");
    V->setUnits("millivolt");
    V->setInitialValue(0.0);

    libcellml::VariablePtr alpha_y = libcellml::Variable::create();
    alpha_y->setName("alpha_y");
    alpha_y->setUnits("per_millisecond");
    alpha_y->setInitialValue(1.0);

    libcellml::VariablePtr beta_y = libcellml::Variable::create();
    beta_y->setName("beta_y");
    beta_y->setUnits("per_millisecond");
    beta_y->setInitialValue(2.0);

    libcellml::VariablePtr y = libcellml::Variable::create();
    y->setName("y");
    y->setUnits("dimensionless");
    y->setInitialValue(1.0);

    libcellml::VariablePtr E_y = libcellml::Variable::create();
    E_y->setName("E_y");
    E_y->setUnits("millivolt");
    E_y->setInitialValue(-85.0);

    libcellml::VariablePtr i_y = libcellml::Variable::create();
    i_y->setName("i_y");
    i_y->setUnits("microA_per_cm2");
    // Note that no initial value is needed for this variable as its value
    // is defined by equation2.

    libcellml::VariablePtr g_y = libcellml::Variable::create();
    g_y->setName("g_y");
    g_y->setUnits("milliS_per_cm2");
    g_y->setInitialValue(36.0);

    libcellml::VariablePtr gamma = libcellml::Variable::create();
    gamma->setName("gamma");
    gamma->setUnits("dimensionless");
    gamma->setInitialValue(4.0);

    //  3.c   Adding the variables to the component. Note that Variables are
    //        added by their pointer (cf. their name).
    component->addVariable(t);
    component->addVariable(V);
    component->addVariable(E_y);
    component->addVariable(gamma);
    component->addVariable(i_y);
    component->addVariable(g_y);
    component->addVariable(alpha_y);
    component->addVariable(beta_y);
    component->addVariable(y);

    //  4.a   Defining the units of millisecond, millivolt, per_millisecond,
    //        microA_per_cm2, and milliS_per_cm2. Note that the dimensionless
    //        units are part of those built-in already, so they don't need to be
    //        defined here.
    libcellml::UnitsPtr ms = libcellml::Units::create();
    ms->setName("millisecond");
    ms->addUnit("second", "milli");

    libcellml::UnitsPtr mV = libcellml::Units::create();
    mV->setName("millivolt");
    mV->addUnit("volt", "milli");

    libcellml::UnitsPtr per_ms = libcellml::Units::create();
    per_ms->setName("per_millisecond");
    per_ms->addUnit("millisecond", -1.0);

    libcellml::UnitsPtr microA_per_cm2 = libcellml::Units::create();
    microA_per_cm2->setName("microA_per_cm2");
    microA_per_cm2->addUnit("ampere", "micro");
    microA_per_cm2->addUnit("metre", "centi", -2.0);

    libcellml::UnitsPtr mS_per_cm2 = libcellml::Units::create();
    mS_per_cm2->setName("milliS_per_cm2");
    mS_per_cm2->addUnit("siemens", "milli");
    mS_per_cm2->addUnit("metre", "centi", -2.0);

    //  4.b   Add these units into the model.
    model->addUnits(ms);
    model->addUnits(mV);
    model->addUnits(per_ms);
    model->addUnits(microA_per_cm2);
    model->addUnits(mS_per_cm2);

    // Link the units used by variables in the model to
    // units added to the model.
    model->linkUnits();

    //  4.c   Validate the final arrangement. No issues are expected at this stage.
    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(model);
    EXPECT_EQ(size_t(0), validator->issueCount());

    //  5.a   Create an Analyser instance and analyse the model.

    libcellml::AnalyserPtr analyser = libcellml::Analyser::create();
    analyser->analyseModel(model);

    //  5.b   Check whether the analyser has encountered any issues.
    EXPECT_EQ(size_t(0), analyser->issueCount());
}